

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

bool __thiscall
perfetto::protos::gen::TestConfig::ParseFromArray(TestConfig *this,void *raw,size_t size)

{
  byte bVar1;
  _Head_base<0UL,_perfetto::protos::gen::TestConfig_DummyFields_*,_false> _Var2;
  bool bVar3;
  short sVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong *puVar8;
  uint32_t uVar9;
  uint8_t cur_byte_2;
  ulong uVar10;
  uint8_t cur_byte_3;
  ulong *puVar11;
  uint8_t cur_byte;
  ulong uVar12;
  uint8_t cur_byte_1;
  ulong *puVar13;
  Field local_50;
  TestConfig *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  (this->unknown_fields_)._M_string_length = 0;
  local_38 = &this->unknown_fields_;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  puVar8 = (ulong *)(size + (long)raw);
  do {
    if (puVar8 <= raw) goto switchD_0023819d_caseD_3;
    bVar1 = (byte)*raw;
    uVar7 = (ulong)bVar1;
    puVar11 = (ulong *)((long)raw + 1);
    if ((char)bVar1 < '\0') {
      uVar7 = (ulong)(bVar1 & 0x7f);
      lVar6 = 7;
      do {
        if ((puVar8 <= puVar11) || (0x38 < lVar6 - 7U)) goto switchD_0023819d_caseD_3;
        uVar5 = *puVar11;
        puVar11 = (ulong *)((long)puVar11 + 1);
        uVar7 = uVar7 | (ulong)((byte)uVar5 & 0x7f) << ((byte)lVar6 & 0x3f);
        lVar6 = lVar6 + 7;
      } while ((char)(byte)uVar5 < '\0');
    }
    uVar5 = uVar7 >> 3;
    if (((uint)uVar5 == 0) || (puVar8 <= puVar11)) goto switchD_0023819d_caseD_3;
    switch((uint)uVar7 & 7) {
    case 0:
      uVar10 = 0;
      uVar12 = 0;
      while( true ) {
        puVar13 = (ulong *)((long)puVar11 + 1);
        uVar10 = (ulong)((byte)*puVar11 & 0x7f) << ((byte)uVar12 & 0x3f) | uVar10;
        if (-1 < (char)(byte)*puVar11) break;
        if ((puVar8 <= puVar13) ||
           (bVar3 = 0x38 < uVar12, uVar12 = uVar12 + 7, puVar11 = puVar13, bVar3))
        goto switchD_0023819d_caseD_3;
      }
      local_50.int_value_ = uVar10 & 0xffffffff00000000;
      break;
    case 1:
      puVar13 = puVar11 + 1;
      if (puVar8 < puVar13) goto switchD_0023819d_caseD_3;
      uVar10 = *puVar11;
      local_50.int_value_ = uVar10 & 0xffffffff00000000;
      break;
    case 2:
      puVar11 = (ulong *)((long)puVar11 + 1);
      uVar12 = 0;
      uVar10 = 0;
      puVar13 = puVar11;
      while (uVar12 = (ulong)(*(byte *)((long)puVar13 + -1) & 0x7f) << ((byte)uVar10 & 0x3f) |
                      uVar12, (char)*(byte *)((long)puVar13 + -1) < '\0') {
        if (puVar8 <= puVar13) goto switchD_0023819d_caseD_3;
        puVar13 = (ulong *)((long)puVar13 + 1);
        puVar11 = (ulong *)((long)puVar11 + 1);
        bVar3 = 0x38 < uVar10;
        uVar10 = uVar10 + 7;
        if (bVar3) goto switchD_0023819d_caseD_3;
      }
      if (uVar12 <= (ulong)((long)puVar8 - (long)puVar11)) {
        local_50.int_value_ = (ulong)puVar11 & 0xffffffff00000000;
        puVar13 = (ulong *)((long)puVar13 + uVar12);
        uVar10 = (ulong)puVar11 & 0xffffffff;
        goto LAB_00238279;
      }
    default:
      goto switchD_0023819d_caseD_3;
    case 5:
      puVar13 = (ulong *)((long)puVar11 + 4);
      if (puVar8 < puVar13) goto switchD_0023819d_caseD_3;
      uVar10 = (ulong)(uint)*puVar11;
      local_50.int_value_ = 0;
    }
    uVar12 = 0;
LAB_00238279:
    raw = puVar13;
  } while ((0xffff < (uint)uVar5) || (0xfffffff < uVar12));
  local_50.int_value_ = local_50.int_value_ | uVar10 & 0xffffffff;
  uVar10 = uVar5 << 0x20 | uVar12;
  uVar7 = uVar10 | (ulong)((uint)uVar7 & 7) << 0x30;
  local_50.size_ = (uint32_t)uVar12;
  local_50.type_ = (uint8_t)(uVar7 >> 0x30);
  local_50.id_ = (uint16_t)(uVar10 >> 0x20);
  sVar4 = (short)uVar5;
  local_40 = this;
  while (sVar4 != 0) {
    if ((ushort)uVar5 < 7) {
      (this->_has_field_).super__Base_bitset<1UL>._M_w =
           (this->_has_field_).super__Base_bitset<1UL>._M_w | 1L << ((byte)uVar5 & 0x3f);
    }
    uVar9 = (uint32_t)local_50.int_value_;
    switch((uint)uVar5 & 0xffff) {
    case 1:
      this->message_count_ = uVar9;
      break;
    case 2:
      this->max_messages_per_second_ = uVar9;
      break;
    case 3:
      this->seed_ = uVar9;
      break;
    case 4:
      this->message_size_ = uVar9;
      break;
    case 5:
      this->send_batch_on_register_ = local_50.int_value_ != 0;
      break;
    case 6:
      _Var2._M_head_impl =
           (this->dummy_fields_).ptr_._M_t.
           super___uniq_ptr_impl<perfetto::protos::gen::TestConfig_DummyFields,_std::default_delete<perfetto::protos::gen::TestConfig_DummyFields>_>
           ._M_t.
           super__Tuple_impl<0UL,_perfetto::protos::gen::TestConfig_DummyFields_*,_std::default_delete<perfetto::protos::gen::TestConfig_DummyFields>_>
           .super__Head_base<0UL,_perfetto::protos::gen::TestConfig_DummyFields_*,_false>.
           _M_head_impl;
      (**(code **)(*(long *)&(_Var2._M_head_impl)->super_CppMessageObj + 0x20))
                (_Var2._M_head_impl,local_50.int_value_,uVar7 & 0xffffffff);
      this = local_40;
      break;
    default:
      protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>(&local_50,local_38);
      this = local_40;
    }
    do {
      if (puVar8 <= raw) goto switchD_0023819d_caseD_3;
      bVar1 = (byte)*raw;
      uVar7 = (ulong)(uint)bVar1;
      puVar11 = (ulong *)((long)raw + 1);
      if ((char)bVar1 < '\0') {
        uVar7 = (ulong)(bVar1 & 0x7f);
        lVar6 = 7;
        do {
          if ((puVar8 <= puVar11) || (0x38 < lVar6 - 7U)) goto switchD_0023819d_caseD_3;
          uVar5 = *puVar11;
          puVar11 = (ulong *)((long)puVar11 + 1);
          uVar7 = uVar7 | (ulong)((byte)uVar5 & 0x7f) << ((byte)lVar6 & 0x3f);
          lVar6 = lVar6 + 7;
        } while ((char)(byte)uVar5 < '\0');
      }
      uVar5 = uVar7 >> 3;
      if (((uint)uVar5 == 0) || (puVar8 <= puVar11)) goto switchD_0023819d_caseD_3;
      switch((uint)uVar7 & 7) {
      case 0:
        uVar10 = 0;
        uVar12 = 0;
        while( true ) {
          puVar13 = (ulong *)((long)puVar11 + 1);
          uVar10 = (ulong)((byte)*puVar11 & 0x7f) << ((byte)uVar12 & 0x3f) | uVar10;
          if (-1 < (char)(byte)*puVar11) break;
          if ((puVar8 <= puVar13) ||
             (bVar3 = 0x38 < uVar12, uVar12 = uVar12 + 7, puVar11 = puVar13, bVar3))
          goto switchD_0023819d_caseD_3;
        }
        local_50.int_value_ = uVar10 & 0xffffffff00000000;
        break;
      case 1:
        puVar13 = puVar11 + 1;
        if (puVar8 < puVar13) goto switchD_0023819d_caseD_3;
        uVar10 = *puVar11;
        local_50.int_value_ = uVar10 & 0xffffffff00000000;
        break;
      case 2:
        puVar11 = (ulong *)((long)puVar11 + 1);
        uVar12 = 0;
        uVar10 = 0;
        puVar13 = puVar11;
        while (uVar12 = (ulong)(*(byte *)((long)puVar13 + -1) & 0x7f) << ((byte)uVar10 & 0x3f) |
                        uVar12, (char)*(byte *)((long)puVar13 + -1) < '\0') {
          if (puVar8 <= puVar13) goto switchD_0023819d_caseD_3;
          puVar13 = (ulong *)((long)puVar13 + 1);
          puVar11 = (ulong *)((long)puVar11 + 1);
          bVar3 = 0x38 < uVar10;
          uVar10 = uVar10 + 7;
          if (bVar3) goto switchD_0023819d_caseD_3;
        }
        if (uVar12 <= (ulong)((long)puVar8 - (long)puVar11)) {
          local_50.int_value_ = (ulong)puVar11 & 0xffffffff00000000;
          puVar13 = (ulong *)((long)puVar13 + uVar12);
          uVar10 = (ulong)puVar11 & 0xffffffff;
          goto LAB_00238585;
        }
      default:
        goto switchD_0023819d_caseD_3;
      case 5:
        puVar13 = (ulong *)((long)puVar11 + 4);
        if (puVar8 < puVar13) goto switchD_0023819d_caseD_3;
        uVar10 = (ulong)(uint)*puVar11;
        local_50.int_value_ = 0;
      }
      uVar12 = 0;
LAB_00238585:
      raw = puVar13;
    } while ((0xffff < (uint)uVar5) || (0xfffffff < uVar12));
    local_50.int_value_ = local_50.int_value_ | uVar10 & 0xffffffff;
    uVar10 = uVar5 << 0x20 | uVar12;
    uVar7 = uVar10 | (uVar7 & 7) << 0x30;
    local_50.size_ = (uint32_t)uVar12;
    local_50.type_ = (uint8_t)(uVar7 >> 0x30);
    local_50.id_ = (uint16_t)(uVar10 >> 0x20);
    sVar4 = (short)uVar5;
  }
switchD_0023819d_caseD_3:
  return puVar8 == (ulong *)raw;
}

Assistant:

bool TestConfig::ParseFromArray(const void* raw, size_t size) {
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 1 /* message_count */:
        field.get(&message_count_);
        break;
      case 2 /* max_messages_per_second */:
        field.get(&max_messages_per_second_);
        break;
      case 3 /* seed */:
        field.get(&seed_);
        break;
      case 4 /* message_size */:
        field.get(&message_size_);
        break;
      case 5 /* send_batch_on_register */:
        field.get(&send_batch_on_register_);
        break;
      case 6 /* dummy_fields */:
        (*dummy_fields_).ParseFromArray(field.data(), field.size());
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}